

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_waiter.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::synchronization_internal::FutexWaiter::Wait(FutexWaiter *this,KernelTimeout t)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  
  bVar3 = true;
  do {
    iVar1 = (this->futex_).super___atomic_base<int>._M_i;
    while (iVar4 = iVar1, iVar4 != 0) {
      LOCK();
      iVar1 = (this->futex_).super___atomic_base<int>._M_i;
      bVar5 = iVar4 == iVar1;
      if (bVar5) {
        (this->futex_).super___atomic_base<int>._M_i = iVar4 + -1;
        iVar1 = iVar4;
      }
      UNLOCK();
      if (bVar5) goto LAB_0026af28;
    }
    if (!bVar3) {
      WaiterBase::MaybeBecomeIdle();
    }
    bVar3 = false;
    uVar2 = WaitUntil(&this->futex_,0,t);
  } while ((uVar2 + 0xb < 0xc) && ((0x881U >> (uVar2 + 0xb & 0x1f) & 1) != 0));
  if (uVar2 != 0xffffff92) {
    raw_log_internal::RawLog
              (kFatal,"futex_waiter.cc",0x55,"Futex operation failed with error %d\n",(ulong)uVar2);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/internal/futex_waiter.cc"
                  ,0x55,"bool absl::synchronization_internal::FutexWaiter::Wait(KernelTimeout)");
  }
LAB_0026af28:
  return iVar4 != 0;
}

Assistant:

bool FutexWaiter::Wait(KernelTimeout t) {
  // Loop until we can atomically decrement futex from a positive
  // value, waiting on a futex while we believe it is zero.
  // Note that, since the thread ticker is just reset, we don't need to check
  // whether the thread is idle on the very first pass of the loop.
  bool first_pass = true;
  while (true) {
    int32_t x = futex_.load(std::memory_order_relaxed);
    while (x != 0) {
      if (!futex_.compare_exchange_weak(x, x - 1,
                                        std::memory_order_acquire,
                                        std::memory_order_relaxed)) {
        continue;  // Raced with someone, retry.
      }
      return true;  // Consumed a wakeup, we are done.
    }

    if (!first_pass) MaybeBecomeIdle();
    const int err = WaitUntil(&futex_, 0, t);
    if (err != 0) {
      if (err == -EINTR || err == -EWOULDBLOCK) {
        // Do nothing, the loop will retry.
      } else if (err == -ETIMEDOUT) {
        return false;
      } else {
        ABSL_RAW_LOG(FATAL, "Futex operation failed with error %d\n", err);
      }
    }
    first_pass = false;
  }
}